

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MockExpectedCallTest.cpp
# Opt level: O0

void __thiscall
TEST_MockExpectedCall_callWithFunctionPointerParameter_Test::
~TEST_MockExpectedCall_callWithFunctionPointerParameter_Test
          (TEST_MockExpectedCall_callWithFunctionPointerParameter_Test *this)

{
  TEST_MockExpectedCall_callWithFunctionPointerParameter_Test *this_local;
  
  ~TEST_MockExpectedCall_callWithFunctionPointerParameter_Test(this);
  operator_delete(this,0x18);
  return;
}

Assistant:

TEST(MockExpectedCall, callWithFunctionPointerParameter)
{
    const SimpleString paramName = "paramName";
    void (*value)() = (void (*)()) 0xdead;
    call->withParameter(paramName, value);
    STRCMP_EQUAL("void (*)()", call->getInputParameterType(paramName).asCharString());
    FUNCTIONPOINTERS_EQUAL(value, call->getInputParameter(paramName).getFunctionPointerValue());
    STRCMP_CONTAINS("funcName -> void (*)() paramName: <0xdead>", call->callToString().asCharString());
}